

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void lws_context_deprecate(lws_context *context,lws_reload_func cb)

{
  lws *wsi_00;
  lws *wsi;
  lws_vhost *vh1;
  lws_vhost *vh;
  lws_reload_func cb_local;
  lws_context *context_local;
  
  for (vh1 = context->vhost_list; vh1 != (lws_vhost *)0x0; vh1 = vh1->vhost_next) {
    wsi_00 = vh1->lserv_wsi;
    if (wsi_00 != (lws *)0x0) {
      *(ulong *)&wsi_00->field_0x2dc = *(ulong *)&wsi_00->field_0x2dc & 0xffffffffffffefff | 0x1000;
      lws_close_free_wsi(wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"ctx deprecate");
      wsi_00->context->deprecation_pending_listen_close_count =
           wsi_00->context->deprecation_pending_listen_close_count + 1;
      for (wsi = (lws *)context->vhost_list; wsi != (lws *)0x0;
          wsi = (lws *)(wsi->sul_validity).list.owner) {
        if ((lws *)(wsi->sul_validity).us == wsi_00) {
          (wsi->sul_validity).us = 0;
        }
      }
    }
  }
  *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfffe | 1;
  context->deprecation_cb = cb;
  return;
}

Assistant:

void
lws_context_deprecate(struct lws_context *context, lws_reload_func cb)
{
	struct lws_vhost *vh = context->vhost_list, *vh1;

	/*
	 * "deprecation" means disable the context from accepting any new
	 * connections and free up listen sockets to be used by a replacement
	 * context.
	 *
	 * Otherwise the deprecated context remains operational, until its
	 * number of connected sockets falls to zero, when it is deleted.
	 */

	/* for each vhost, close his listen socket */

	while (vh) {
		struct lws *wsi = vh->lserv_wsi;

		if (wsi) {
			wsi->socket_is_permanently_unusable = 1;
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "ctx deprecate");
			wsi->context->deprecation_pending_listen_close_count++;
			/*
			 * other vhosts can share the listen port, they
			 * point to the same wsi.  So zap those too.
			 */
			vh1 = context->vhost_list;
			while (vh1) {
				if (vh1->lserv_wsi == wsi)
					vh1->lserv_wsi = NULL;
				vh1 = vh1->vhost_next;
			}
		}
		vh = vh->vhost_next;
	}

	context->deprecated = 1;
	context->deprecation_cb = cb;
}